

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshEdit.cpp
# Opt level: O1

void __thiscall
CMU462::HalfedgeMesh::buildSubdivisionVertexList
          (HalfedgeMesh *this,
          vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *subDVertices)

{
  _List_node_base *p_Var1;
  pointer pVVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  
  std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::resize
            (subDVertices,
             (this->faces).super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl.
             _M_node._M_size +
             (this->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl.
             _M_node._M_size +
             (this->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>.
             _M_impl._M_node._M_size);
  for (p_Var4 = (this->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>.
                _M_impl._M_node.super__List_node_base._M_next;
      p_Var4 != (_List_node_base *)&this->vertices; p_Var4 = p_Var4->_M_next) {
    p_Var1 = p_Var4[6]._M_next;
    pVVar2 = (subDVertices->super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    pVVar2[(long)p_Var1].z = (double)p_Var4[5]._M_prev;
    p_Var3 = p_Var4[5]._M_next;
    pVVar2 = pVVar2 + (long)p_Var1;
    pVVar2->x = (double)p_Var4[4]._M_prev;
    pVVar2->y = (double)p_Var3;
  }
  for (p_Var4 = (this->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl.
                _M_node.super__List_node_base._M_next; p_Var4 != (_List_node_base *)&this->edges;
      p_Var4 = p_Var4->_M_next) {
    p_Var1 = p_Var4[3]._M_next;
    pVVar2 = (subDVertices->super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    pVVar2[(long)p_Var1].z = (double)p_Var4[2]._M_prev;
    p_Var3 = p_Var4[2]._M_next;
    pVVar2 = pVVar2 + (long)p_Var1;
    pVVar2->x = (double)p_Var4[1]._M_prev;
    pVVar2->y = (double)p_Var3;
  }
  for (p_Var4 = (this->faces).super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl.
                _M_node.super__List_node_base._M_next; p_Var4 != (_List_node_base *)&this->faces;
      p_Var4 = p_Var4->_M_next) {
    p_Var1 = p_Var4[1]._M_prev;
    pVVar2 = (subDVertices->super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    pVVar2[(long)p_Var1].z = (double)p_Var4[3]._M_next;
    p_Var3 = p_Var4[2]._M_prev;
    pVVar2 = pVVar2 + (long)p_Var1;
    pVVar2->x = (double)p_Var4[2]._M_next;
    pVVar2->y = (double)p_Var3;
  }
  return;
}

Assistant:

void HalfedgeMesh::buildSubdivisionVertexList(vector<Vector3D>& subDVertices) {
	// TODO Resize the vertex list so that it can hold all the vertices.
	Size size = nEdges() + nFaces() + nVertices();
	subDVertices.resize(size);

	// TODO Iterate over vertices, assigning Vertex::newPosition to the
	// appropriate location in the new vertex list.
	for (VertexIter x = verticesBegin(); x != verticesEnd(); x++) {
		subDVertices[x->index] = x->newPosition;
	} 

	// TODO Iterate over edges, assigning Edge::newPosition to the appropriate
	// location in the new vertex list.
	for (EdgeIter x = edgesBegin(); x != edgesEnd(); x++) {
		subDVertices[x->index] = x->newPosition;
	}

	// TODO Iterate over faces, assigning Face::newPosition to the appropriate
	// location in the new vertex list.
	for (FaceIter x = facesBegin(); x != facesEnd(); x++) {
		subDVertices[x->index] = x->newPosition;
	}

	//showError("buildSubdivisionVertexList() not implemented.");
}